

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings_pack.cpp
# Opt level: O3

int __thiscall libtorrent::setting_by_name(libtorrent *this,string_view key)

{
  char *pcVar1;
  int iVar2;
  libtorrent *plVar3;
  int k;
  ulong uVar4;
  long *__s1;
  undefined8 *puVar5;
  long lVar6;
  size_type __rlen;
  
  __s1 = (long *)key._M_len;
  puVar5 = &(anonymous_namespace)::str_settings;
  uVar4 = 0;
  do {
    pcVar1 = (char *)*puVar5;
    plVar3 = (libtorrent *)strlen(pcVar1);
    if (plVar3 == this) {
      if (this == (libtorrent *)0x0) goto LAB_002f5493;
      iVar2 = bcmp(__s1,pcVar1,(size_t)this);
      if (iVar2 == 0) goto LAB_002f5493;
    }
    uVar4 = uVar4 + 1;
    puVar5 = puVar5 + 7;
  } while (uVar4 != 0xd);
  uVar4 = 0x4000;
  lVar6 = 0;
  do {
    pcVar1 = *(char **)((long)&(anonymous_namespace)::int_settings + lVar6);
    plVar3 = (libtorrent *)strlen(pcVar1);
    if (plVar3 == this) {
      if (this == (libtorrent *)0x0) goto LAB_002f5493;
      iVar2 = bcmp(__s1,pcVar1,(size_t)this);
      if (iVar2 == 0) goto LAB_002f5493;
    }
    uVar4 = (ulong)((int)uVar4 + 1);
    lVar6 = lVar6 + 0x20;
  } while (lVar6 != 0x13e0);
  uVar4 = 0x8000;
  lVar6 = 0;
  do {
    pcVar1 = *(char **)((long)&(anonymous_namespace)::bool_settings + lVar6);
    plVar3 = (libtorrent *)strlen(pcVar1);
    if (plVar3 == this) {
      if (this == (libtorrent *)0x0) goto LAB_002f5493;
      iVar2 = bcmp(__s1,pcVar1,(size_t)this);
      if (iVar2 == 0) goto LAB_002f5493;
    }
    uVar4 = (ulong)((int)uVar4 + 1);
    lVar6 = lVar6 + 0x20;
  } while (lVar6 != 0xa80);
  if ((this == (libtorrent *)0x8) && (*__s1 == 0x736f745f72656570)) {
    uVar4 = 0x4028;
  }
  else {
    uVar4 = 0xffffffff;
  }
LAB_002f5493:
  return (int)uVar4;
}

Assistant:

int setting_by_name(string_view const key)
	{
		for (int k = 0; k < str_settings.end_index(); ++k)
		{
			if (key != str_settings[k].name) continue;
			return settings_pack::string_type_base + k;
		}
		for (int k = 0; k < int_settings.end_index(); ++k)
		{
			if (key != int_settings[k].name) continue;
			return settings_pack::int_type_base + k;
		}
		for (int k = 0; k < bool_settings.end_index(); ++k)
		{
			if (key != bool_settings[k].name) continue;
			return settings_pack::bool_type_base + k;
		}

		// backwards compatibility with previous name
		if (key == "peer_tos")
			return settings_pack::peer_dscp;

		return -1;
	}